

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_value.hpp
# Opt level: O2

value_ptr __thiscall
pstore::dump::
make_value<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<true>,std::pair<pstore::uint128_const,pstore::extent<pstore::repo::fragment>>,std::shared_ptr<pstore::dump::value>(*)(std::pair<pstore::uint128_const,pstore::extent<pstore::repo::fragment>>const&)>
          (dump *this,iterator_base<true> *first,iterator_base<true> *last,
          _func_shared_ptr<pstore::dump::value>_pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_ptr
          *mk)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  value_ptr vVar1;
  anon_class_16_2_01098c5c __f;
  container members;
  container local_228;
  iterator_base<true> local_210;
  iterator_base<true> local_120;
  
  local_228.
  super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  index::
  hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  ::iterator_base<true>::iterator_base(&local_120,first);
  index::
  hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  ::iterator_base<true>::iterator_base(&local_210,last);
  __f.mk = mk;
  __f.members = &local_228;
  std::
  for_each<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<true>,pstore::dump::make_value<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<true>,std::pair<pstore::uint128_const,pstore::extent<pstore::repo::fragment>>,std::shared_ptr<pstore::dump::value>(*)(std::pair<pstore::uint128_const,pstore::extent<pstore::repo::fragment>>const&)>(pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<true>const&,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<true>const&,std::shared_ptr<pstore::dump::value>(*)(std::pair<pstore::uint128_const,pstore::extent<pstore::repo::fragment>>const&))::_lambda(std::pair<pstore::uint128_const,pstore::extent<pstore::repo::fragment>>const&)_1_>
            (&local_120,&local_210,__f);
  std::
  unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
  ::~unique_ptr(&local_210.pos_);
  std::
  unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
  ::~unique_ptr(&local_120.pos_);
  make_value((container *)this);
  std::
  vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ::~vector(&local_228);
  vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (value_ptr)vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

value_ptr make_value (InputIterator const & first, InputIterator const & last,
                              MakeValueFn mk = &details::default_make_value<ValueType const &>) {
            array::container members;
            std::for_each (first, last,
                           [&members, mk] (ValueType const & v) { members.emplace_back (mk (v)); });
            return make_value (std::move (members));
        }